

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O0

bitwidth_t __thiscall slang::ast::Type::getBitWidth(Type *this)

{
  Kind KVar1;
  bool bVar2;
  IntegralType *pIVar3;
  FloatingType *pFVar4;
  Type *ct;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  getCanonicalType((Type *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  bVar2 = isIntegral((Type *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (bVar2) {
    pIVar3 = Symbol::as<slang::ast::IntegralType>((Symbol *)0x588122);
    return pIVar3->bitWidth;
  }
  bVar2 = isFloating((Type *)0x588135);
  if (bVar2) {
    pFVar4 = Symbol::as<slang::ast::FloatingType>((Symbol *)0x588145);
    KVar1 = pFVar4->floatKind;
    if (KVar1 == Real) {
      return 0x40;
    }
    if (KVar1 == ShortReal) {
      return 0x20;
    }
    if (KVar1 == RealTime) {
      return 0x40;
    }
  }
  return 0;
}

Assistant:

bitwidth_t Type::getBitWidth() const {
    const Type& ct = getCanonicalType();
    if (ct.isIntegral())
        return ct.as<IntegralType>().bitWidth;

    if (ct.isFloating()) {
        switch (ct.as<FloatingType>().floatKind) {
            case FloatingType::Real:
                return 64;
            case FloatingType::RealTime:
                return 64;
            case FloatingType::ShortReal:
                return 32;
        }
    }
    return 0;
}